

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O0

void __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>>::
rt_binary_expr<1ul,viennamath::op_mult<double>,1ul>
          (rt_binary_expr<viennamath::rt_expression_interface<double>> *this,
          ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
          *param_1)

{
  element_type *__p;
  rt_variable<viennamath::rt_expression_interface<double>_> *prVar1;
  auto_ptr<viennamath::rt_expression_interface<double>_> local_48;
  rt_expression_interface<double> *local_40;
  auto_ptr local_38 [8];
  rt_expression_interface<double> *local_30;
  ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
  *local_18;
  ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
  *param_1_local;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  local_18 = param_1;
  param_1_local =
       (ct_binary_expr<viennamath::ct_variable<1UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<1UL>_>
        *)this;
  rt_expression_interface<double>::rt_expression_interface((rt_expression_interface<double> *)this);
  *(undefined ***)this = &PTR__rt_binary_expr_0011c708;
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::auto_ptr
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)(this + 8),
             (element_type *)0x0);
  __p = (element_type *)operator_new(8);
  __p->_vptr_op_interface = (_func_int **)0x0;
  op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>::op_binary
            ((op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_> *
             )__p);
  std::auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>::auto_ptr
            ((auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_> *)
             (this + 0x10),__p);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::auto_ptr
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)(this + 0x18),
             (element_type *)0x0);
  prVar1 = (rt_variable<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  rt_variable<viennamath::rt_expression_interface<double>_>::rt_variable(prVar1,1);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::auto_ptr
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)local_38,
             (element_type *)prVar1);
  local_30 = (rt_expression_interface<double> *)
             std::auto_ptr::operator_cast_to_auto_ptr_ref(local_38);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator=
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)(this + 8),
             (auto_ptr_ref<viennamath::rt_expression_interface<double>_>)local_30);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::~auto_ptr
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)local_38);
  prVar1 = (rt_variable<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
  rt_variable<viennamath::rt_expression_interface<double>_>::rt_variable(prVar1,1);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::auto_ptr
            (&local_48,(element_type *)prVar1);
  local_40 = (rt_expression_interface<double> *)
             std::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_48);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator=
            ((auto_ptr<viennamath::rt_expression_interface<double>_> *)(this + 0x18),
             (auto_ptr_ref<viennamath::rt_expression_interface<double>_>)local_40);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::~auto_ptr(&local_48);
  return;
}

Assistant:

explicit rt_binary_expr(ct_binary_expr<ct_variable<id1>, OP, ct_variable<id2> > const & /*other*/) : op_(new op_binary<OP, InterfaceType>())
      {
        //std::cout << "Constructing from expression " << other << " to " << OP::apply(value1, value2) << std::endl;
        lhs_ = std::auto_ptr<InterfaceType>(new rt_variable<InterfaceType>(id1));
        rhs_ = std::auto_ptr<InterfaceType>(new rt_variable<InterfaceType>(id2));
      }